

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementCableANCF.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementCableANCF::ChElementCableANCF(ChElementCableANCF *this,void **vtt)

{
  ChLoadableU CVar1;
  ChLoadableUVW CVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b62688;
  auVar4 = ZEXT816(0) << 0x40;
  auVar5 = ZEXT1632(auVar4);
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K =
       (ChMatrixDynamic<double>)auVar5._0_24_;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar5._24_8_;
  *(undefined1 (*) [32])
   &(this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = auVar5;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_00b59698;
  (this->super_ChElementBeam).mass = 0.0;
  (this->super_ChElementBeam).length = 0.0;
  CVar1 = *(ChLoadableU *)(vtt + 1);
  this->super_ChLoadableU = CVar1;
  *(void **)((long)(this->m_GenForceVec0).
                   super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
                   array + *(long *)((long)CVar1 + -0x78) + -0x50) = vtt[2];
  CVar2 = *(ChLoadableUVW *)(vtt + 3);
  this->super_ChLoadableUVW = CVar2;
  *(void **)((long)(this->m_GenForceVec0).
                   super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.
                   array + *(long *)((long)CVar2 + -0x78) + -0x48) = vtt[4];
  pp_Var3 = (_func_int **)*vtt;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       pp_Var3;
  this->super_ChLoadableU = *(ChLoadableU *)(vtt + 5);
  *(void **)(pp_Var3[-3] +
            (long)&(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
                   _vptr_ChElementBase) = vtt[6];
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 7);
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                 )SUB3224(ZEXT1632(auVar4),0);
  (this->section).super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)SUB328(ZEXT1632(auVar4),0x18);
  (this->section).super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::resize(&this->nodes,2);
  this->m_use_damping = false;
  this->m_alpha = 0.0;
  return;
}

Assistant:

ChElementCableANCF::ChElementCableANCF() {
    nodes.resize(2);
    m_use_damping = false;  // flag to add internal damping and its Jacobian
    m_alpha = 0.0;          // scaling factor for internal damping

    // this->StiffnessMatrix.Resize(this->GetNdofs(), this->GetNdofs());
    // this->MassMatrix.Resize(this->GetNdofs(), this->GetNdofs());
}